

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O2

Result __thiscall
tonk::MessageCompressor::Initialize(MessageCompressor *this,uint maxCompressedMessagesBytes)

{
  ZSTD_parameters params;
  uint uVar1;
  ZSTD_CCtx *pZVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined4 in_EDX;
  Result *success;
  undefined4 in_register_00000034;
  long lVar5;
  allocator local_89;
  string local_88 [32];
  ZSTD_compressionParameters local_68;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  ZSTD_compressionParameters local_38;
  
  lVar5 = CONCAT44(in_register_00000034,maxCompressedMessagesBytes);
  *(undefined4 *)(lVar5 + 0x5dd0) = in_EDX;
  pZVar2 = ZSTD_createCCtx();
  *(ZSTD_CCtx **)(lVar5 + 0x5dc8) = pZVar2;
  if (pZVar2 == (ZSTD_CCtx *)0x0) {
    std::__cxx11::string::string(local_88,"ZSTD_createCCtx failed",(allocator *)&local_38);
    puVar4 = (undefined8 *)operator_new(0x38);
    *puVar4 = "SessionOutgoing::Initialize";
    std::__cxx11::string::string((string *)(puVar4 + 1),local_88);
  }
  else {
    ZSTD_getCParams(&local_38,1,(ulong)*(uint *)(lVar5 + 0x5dd0),24000);
    local_68.targetLength = local_38.targetLength;
    local_68.strategy = local_38.strategy;
    local_68.windowLog = local_38.windowLog;
    local_68.chainLog = local_38.chainLog;
    uStack_4c = 0;
    uStack_48 = 0;
    local_44 = 1;
    params.cParams.searchLog = local_38.searchLog;
    params.cParams.hashLog = local_38.hashLog;
    params.cParams.targetLength = local_68.targetLength;
    params.cParams.searchLength = local_38.searchLength;
    params.cParams.windowLog = local_38.windowLog;
    params.cParams.chainLog = local_38.chainLog;
    params.cParams.strategy = local_68.strategy;
    params.fParams.contentSizeFlag = 0;
    params.fParams.checksumFlag = 0;
    params.fParams.noDictIDFlag = 1;
    sVar3 = ZSTD_compressBegin_advanced
                      (*(ZSTD_CCtx **)(lVar5 + 0x5dc8),(void *)0x0,0,params,0xffffffffffffffff);
    uVar1 = ZSTD_isError(sVar3);
    if (uVar1 != 0) {
      std::__cxx11::string::string(local_88,"ZSTD_compressBegin_advanced failed",&local_89);
      puVar4 = (undefined8 *)operator_new(0x38);
      *puVar4 = "SessionOutgoing::Initialize";
      std::__cxx11::string::string((string *)(puVar4 + 1),local_88);
      *(undefined4 *)(puVar4 + 5) = 6;
      puVar4[6] = sVar3;
      goto LAB_0014e911;
    }
    sVar3 = ZSTD_getBlockSize(*(ZSTD_CCtx **)(lVar5 + 0x5dc8));
    if (*(uint *)(lVar5 + 0x5dd0) <= sVar3) {
      (this->History).Buffer[0] = '\0';
      (this->History).Buffer[1] = '\0';
      (this->History).Buffer[2] = '\0';
      (this->History).Buffer[3] = '\0';
      (this->History).Buffer[4] = '\0';
      (this->History).Buffer[5] = '\0';
      (this->History).Buffer[6] = '\0';
      (this->History).Buffer[7] = '\0';
      return (Result)(ErrorResult *)this;
    }
    std::__cxx11::string::string(local_88,"Zstd block size is too small",&local_89);
    puVar4 = (undefined8 *)operator_new(0x38);
    *puVar4 = "SessionOutgoing::Initialize";
    std::__cxx11::string::string((string *)(puVar4 + 1),local_88);
  }
  *(undefined4 *)(puVar4 + 5) = 6;
  puVar4[6] = 2;
LAB_0014e911:
  *(undefined8 **)(this->History).Buffer = puVar4;
  std::__cxx11::string::~string(local_88);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result MessageCompressor::Initialize(unsigned maxCompressedMessagesBytes)
{
    MaxCompressedMessagesBytes = maxCompressedMessagesBytes;
    CCtx = ZSTD_createCCtx();

    if (!CCtx) {
        return Result("SessionOutgoing::Initialize", "ZSTD_createCCtx failed", ErrorType::Zstd);
    }

    const size_t estimatedPacketSize = MaxCompressedMessagesBytes;

    ZSTD_parameters zParams;

    zParams.cParams = ZSTD_getCParams(
        kCompressionLevel,
        estimatedPacketSize,
        kCompressionDictBytes);

    zParams.fParams.checksumFlag = 0;
    zParams.fParams.contentSizeFlag = 0;
    zParams.fParams.noDictIDFlag = 1;

    const size_t icsResult = ZSTD_compressBegin_advanced(
        CCtx,
        nullptr,
        0,
        zParams,
        ZSTD_CONTENTSIZE_UNKNOWN);

    if (0 != ZSTD_isError(icsResult)) {
        TONK_DEBUG_BREAK();
        return Result("SessionOutgoing::Initialize", "ZSTD_compressBegin_advanced failed", ErrorType::Zstd, icsResult);
    }

    const size_t blockSizeBytes = ZSTD_getBlockSize(CCtx);
    if (blockSizeBytes < MaxCompressedMessagesBytes) {
        return Result("SessionOutgoing::Initialize", "Zstd block size is too small", ErrorType::Zstd);
    }

    return Result::Success();
}